

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O1

string * __thiscall
agr::getCommandOut_abi_cxx11_(string *__return_storage_ptr__,agr *this,char *command)

{
  FILE *__stream;
  char *pcVar1;
  runtime_error *this_00;
  array<char,_128UL> buffer;
  char acStack_a8 [128];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  __stream = popen((char *)this,"r");
  if (__stream == (FILE *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"popen() failed!");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  while (pcVar1 = fgets(acStack_a8,0x80,__stream), pcVar1 != (char *)0x0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  pclose(__stream);
  return __return_storage_ptr__;
}

Assistant:

std::string getCommandOut( const char* command ) 
   {
    std::array<char, 128> buffer;
    std::string result;
    #ifdef _WIN32
      std::unique_ptr<FILE, decltype( & _pclose )> pipe( _popen( command, "r" ), _pclose );
    #else
      std::unique_ptr<FILE, decltype( & pclose )> pipe( popen( command, "r" ), pclose );
    #endif

    if ( ! pipe ) 
     {
      throw std::runtime_error( "popen() failed!" );
     }

    while ( fgets( buffer.data(), buffer.size(), pipe.get() ) != nullptr ) 
     {
      result += buffer.data();
     }

    return result;
   }